

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void basic_suite::test_false(void)

{
  char input [6];
  decoder_type decoder;
  undefined4 local_150;
  value local_14c;
  value_type local_148 [8];
  basic_decoder<char> local_140;
  
  local_140.input.tail = local_148 + 5;
  builtin_memcpy(local_148,"false",6);
  local_140.input.head = local_148;
  memset(&local_140.current,0,0x120);
  local_140.current.code = uninitialized;
  local_140.current.view.head = (const_pointer)0x0;
  local_140.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_140);
  local_14c = local_140.current.code;
  local_150 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::false_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x10b,"void basic_suite::test_false()",&local_14c,&local_150);
  if (error_unexpected_token < local_140.current.code) {
    if (local_140.current.code == end) {
      local_140.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_140);
    }
  }
  local_150 = 0;
  local_14c = local_140.current.code;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x10d,"void basic_suite::test_false()",&local_14c,&local_150);
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}